

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<bool>::Swap(RepeatedField<bool> *this,RepeatedField<bool> *other)

{
  Arena *pAVar1;
  Arena *pAVar2;
  undefined1 local_28 [8];
  RepeatedField<bool> temp;
  RepeatedField<bool> *other_local;
  RepeatedField<bool> *this_local;
  
  if (this != other) {
    temp.arena_or_elements_ = other;
    pAVar1 = GetArena(this);
    pAVar2 = GetArena((RepeatedField<bool> *)temp.arena_or_elements_);
    if (pAVar1 == pAVar2) {
      InternalSwap(this,(RepeatedField<bool> *)temp.arena_or_elements_);
    }
    else {
      pAVar1 = GetArena((RepeatedField<bool> *)temp.arena_or_elements_);
      RepeatedField((RepeatedField<bool> *)local_28,pAVar1);
      MergeFrom((RepeatedField<bool> *)local_28,this);
      CopyFrom(this,(RepeatedField<bool> *)temp.arena_or_elements_);
      UnsafeArenaSwap((RepeatedField<bool> *)temp.arena_or_elements_,(RepeatedField<bool> *)local_28
                     );
      ~RepeatedField((RepeatedField<bool> *)local_28);
    }
  }
  return;
}

Assistant:

void RepeatedField<Element>::Swap(RepeatedField* other) {
  if (this == other) return;
  if (GetArena() == other->GetArena()) {
    InternalSwap(other);
  } else {
    RepeatedField<Element> temp(other->GetArena());
    temp.MergeFrom(*this);
    CopyFrom(*other);
    other->UnsafeArenaSwap(&temp);
  }
}